

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
luna::Parse(luna *this,Lexer *lexer)

{
  String *pSVar1;
  TokenDetail *pTVar2;
  undefined8 *puVar3;
  ParseException *this_00;
  ParserImpl impl;
  undefined1 local_80 [16];
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_58;
  String *local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_38;
  String *local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined4 local_18;
  
  local_70.number_ = 0.0;
  uStack_68._0_4_ = 0;
  uStack_68._4_4_ = 0;
  local_60._0_4_ = 0;
  local_60._4_4_ = 0;
  local_58._0_4_ = 0x11e;
  local_50 = (String *)0x0;
  uStack_48._0_4_ = 0;
  uStack_48._4_4_ = 0;
  local_40._0_4_ = 0;
  local_40._4_4_ = 0;
  local_38._0_4_ = 0x11e;
  local_30 = (String *)0x0;
  uStack_28._0_4_ = 0;
  uStack_28._4_4_ = 0;
  local_20._0_4_ = 0;
  local_20._4_4_ = 0;
  local_18 = 0x11e;
  local_80._8_8_ = lexer;
  anon_unknown.dwarf_b20dc::ParserImpl::ParseBlock((ParserImpl *)local_80);
  pTVar2 = anon_unknown.dwarf_b20dc::ParserImpl::NextToken((ParserImpl *)(local_80 + 8));
  if (pTVar2->token_ == 0x11e) {
    puVar3 = (undefined8 *)operator_new(0x18);
    pSVar1 = (String *)((GCObject *)local_80._8_8_)->next_;
    *puVar3 = &PTR__Chunk_00187d88;
    puVar3[1] = local_80._0_8_;
    puVar3[2] = pSVar1;
    *(undefined8 **)this = puVar3;
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           this;
  }
  this_00 = (ParseException *)__cxa_allocate_exception(0x20);
  ParseException::ParseException(this_00,"expect <eof>",(TokenDetail *)&local_70);
  __cxa_throw(this_00,&ParseException::typeinfo,Exception::~Exception);
}

Assistant:

std::unique_ptr<SyntaxTree> Parse(Lexer *lexer)
    {
        ParserImpl impl(lexer);
        return impl.Parse();
    }